

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerExtendUInt32(I64ToI32Lowering *this,Unary *curr)

{
  Index index;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  Const *value;
  LocalSet *any;
  Block *e;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_03;
  Block *result;
  undefined1 local_38 [8];
  TempVar highBits;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  wasm::Type::Type((Type *)&result,i32);
  getTemp((TempVar *)local_38,this,(Type)result);
  this_03 = &this->builder;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_03)
  ;
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_03)
  ;
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)local_38);
  this_02 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_03)
  ;
  value = Builder::makeConst<int>(this_02,0);
  any = Builder::makeLocalSet(this_01,index,(Expression *)value);
  e = Builder::blockify(this_00,(Expression *)any,*(Expression **)(highBits.ty.id + 0x18));
  setOutParam(this,(Expression *)e,(TempVar *)local_38);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)e);
  TempVar::~TempVar((TempVar *)local_38);
  return;
}

Assistant:

void lowerExtendUInt32(Unary* curr) {
    TempVar highBits = getTemp();
    Block* result = builder->blockify(
      builder->makeLocalSet(highBits, builder->makeConst(int32_t(0))),
      curr->value);
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }